

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O3

void N_VAbs_MultiFab(N_Vector x,N_Vector z)

{
  uint uVar1;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  MFIter mfi;
  long local_188;
  Box local_12c;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  this = *(FabArray<amrex::FArrayBox> **)((long)x->content + 8);
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)z->content + 8);
  uVar1 = (this->super_FabArrayBase).n_comp;
  amrex::MFIter::MFIter(&local_90,&this->super_FabArrayBase,'\0');
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      amrex::BATransformer::operator()
                (&local_12c,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,this,&local_90);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this_00,&local_90);
      if (0 < (int)uVar1) {
        lVar2 = (long)local_12c.smallend.vect[1];
        local_188 = (lVar2 - local_110.begin.y) * local_110.jstride * 8 +
                    (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 +
                    (long)local_110.p;
        lVar7 = (lVar2 - local_d0.begin.y) * local_d0.jstride * 8 +
                (long)local_12c.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8 +
                (long)local_d0.p;
        uVar5 = 0;
        do {
          iVar3 = local_12c.smallend.vect[2];
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                lVar6 = ((long)iVar3 - (long)local_110.begin.z) * local_110.kstride * 8 + local_188;
                lVar4 = ((long)iVar3 - (long)local_d0.begin.z) * local_d0.kstride * 8 + lVar7;
                lVar9 = lVar2;
                do {
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    lVar8 = 0;
                    do {
                      *(ulong *)(lVar6 + lVar8 * 8) =
                           *(ulong *)(lVar4 + lVar8 * 8) & 0x7fffffffffffffff;
                      lVar8 = lVar8 + 1;
                    } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                             (int)lVar8);
                  }
                  lVar9 = lVar9 + 1;
                  lVar6 = lVar6 + local_110.jstride * 8;
                  lVar4 = lVar4 + local_d0.jstride * 8;
                } while (local_12c.bigend.vect[1] + 1 != (int)lVar9);
              }
              bVar10 = iVar3 != local_12c.bigend.vect[2];
              iVar3 = iVar3 + 1;
            } while (bVar10);
          }
          uVar5 = uVar5 + 1;
          local_188 = local_188 + local_110.nstride * 8;
          lVar7 = lVar7 + local_d0.nstride * 8;
        } while (uVar5 != uVar1);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void N_VAbs_MultiFab(N_Vector x, N_Vector z)
{
    using namespace amrex;

    MultiFab *mf_x = amrex::sundials::getMFptr(x);
    MultiFab *mf_z = amrex::sundials::getMFptr(z);
    sunindextype ncomp = mf_x->nComp();

    // ghost cells not included
    for (MFIter mfi(*mf_x); mfi.isValid(); ++mfi)
    {
         const amrex::Box& bx = mfi.validbox();
         Array4<Real> const& x_fab = mf_x->array(mfi);
         Array4<Real> const& z_fab = mf_z->array(mfi);

         amrex::ParallelFor(bx, ncomp,
         [=] AMREX_GPU_DEVICE (int i, int j, int k, int c) noexcept
         {
             z_fab(i,j,k,c) = SUNRabs(x_fab(i,j,k,c));
         });
    }
}